

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

basic_value<toml::type_config> *
toml::parse<toml::type_config>
          (basic_value<toml::type_config> *__return_storage_ptr__,istream *is,string fname,spec s)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer peVar3;
  pointer peVar4;
  string fname_00;
  spec s_00;
  value_type *v;
  error_type *peVar5;
  undefined8 *puVar6;
  long *in_RDX;
  error_info *extraout_RDX;
  error_info *extraout_RDX_00;
  error_info *extraout_RDX_01;
  error_info *err;
  pointer peVar7;
  string msg;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  res;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  _Alloc_hider _Var8;
  undefined8 in_stack_fffffffffffffe70;
  size_type sVar9;
  undefined1 in_stack_fffffffffffffe78;
  undefined1 uVar10;
  undefined7 in_stack_fffffffffffffe79;
  undefined8 uStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  string local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  local_100;
  
  plVar1 = in_RDX + 2;
  if ((long *)*in_RDX == plVar1) {
    local_110 = *plVar1;
    lStack_108 = in_RDX[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *plVar1;
    local_120 = (long *)*in_RDX;
  }
  local_118 = in_RDX[1];
  *in_RDX = (long)plVar1;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  fname_00.field_2._8_8_ = in_stack_fffffffffffffe60;
  fname_00._0_24_ = fname._0_24_;
  s_00._8_8_ = in_stack_fffffffffffffe70;
  s_00.version._0_8_ = in_stack_fffffffffffffe68;
  s_00.v1_1_0_add_escape_sequence_e = (bool)in_stack_fffffffffffffe78;
  s_00._17_7_ = in_stack_fffffffffffffe79;
  try_parse<toml::type_config>(&local_100,is,fname_00,s_00);
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_100.is_ok_ != true) {
    paVar2 = &local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)paVar2;
    peVar5 = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             ::unwrap_err(&local_100,(source_location)0x575b20);
    peVar7 = (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
             _M_impl.super__Vector_impl_data._M_start;
    peVar3 = (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (peVar7 != peVar3) {
      err = extraout_RDX;
      do {
        format_error_abi_cxx11_(&local_140,(toml *)peVar7,err);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append(&local_178,local_140._M_dataplus._M_p,local_140._M_string_length);
        err = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          err = extraout_RDX_01;
        }
        peVar7 = peVar7 + 1;
      } while (peVar7 != peVar3);
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x40);
    uVar10 = local_178.field_2._M_local_buf[0];
    sVar9 = local_178._M_string_length;
    _Var8._M_p = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == paVar2) {
      uStack_180 = local_178.field_2._8_8_;
      _Var8._M_p = (pointer)&stack0xfffffffffffffe78;
    }
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)paVar2;
    peVar5 = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             ::unwrap_err(&local_100,(source_location)0x575b38);
    peVar3 = (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
             _M_impl.super__Vector_impl_data._M_start;
    peVar4 = (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    peVar7 = (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>).
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (peVar5->super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *puVar6 = &PTR__syntax_error_005767e0;
    puVar6[1] = puVar6 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xfffffffffffffe78) {
      puVar6[3] = CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,uVar10);
      puVar6[4] = uStack_180;
    }
    else {
      puVar6[1] = _Var8._M_p;
      puVar6[3] = CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,uVar10);
    }
    puVar6[2] = sVar9;
    puVar6[5] = peVar3;
    puVar6[6] = peVar4;
    puVar6[7] = peVar7;
    local_148 = 0;
    local_158 = 0;
    uStack_150 = 0;
    __cxa_throw(puVar6,&syntax_error::typeinfo,syntax_error::~syntax_error);
  }
  v = result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
      ::unwrap(&local_100,(source_location)0x575b08);
  basic_value<toml::type_config>::basic_value(__return_storage_ptr__,v);
  result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
  ::cleanup(&local_100,(EVP_PKEY_CTX *)v);
  return __return_storage_ptr__;
}

Assistant:

basic_value<TC> parse(std::istream& is, std::string fname = "unknown file", spec s = spec::default_version())
{
    auto res = try_parse<TC>(is, std::move(fname), std::move(s));
    if(res.is_ok())
    {
        return res.unwrap();
    }
    else
    {
        std::string msg;
        for(const auto& err : res.unwrap_err())
        {
            msg += format_error(err);
        }
        throw syntax_error(std::move(msg), std::move(res.unwrap_err()));
    }
}